

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>>::findOrInsert<QGraphicsItem*>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> *this,QGraphicsItem **key)

{
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  Bucket local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (Bucket)ZEXT816(0);
  uVar2 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  uVar2 = uVar2 >> 0x20 ^ *(ulong *)(this + 0x18) ^ uVar2;
  if (*(long *)(this + 0x10) != 0) {
    local_38 = findBucketWithHash<QGraphicsItem*>(this,key,uVar2);
    if ((local_38.span)->offsets[local_38.index] != 0xff) {
      uVar2 = ((ulong)((long)local_38.span - *(long *)(this + 0x20)) >> 4) * 0x1c71c71c71c71c80 |
              local_38.index;
      bVar1 = true;
      goto LAB_005fe107;
    }
  }
  if (*(ulong *)(this + 0x10) >> 1 <= *(ulong *)(this + 8)) {
    Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_>::rehash
              ((Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *)this,
               *(ulong *)(this + 8) + 1);
    local_38 = findBucketWithHash<QGraphicsItem*>(this,key,uVar2);
  }
  Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_>::Bucket::insert(&local_38);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  uVar2 = ((ulong)((long)local_38.span - *(long *)(this + 0x20)) >> 4) * 0x1c71c71c71c71c80 |
          local_38.index;
  bVar1 = false;
LAB_005fe107:
  (__return_storage_ptr__->it).d =
       (Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *)this;
  (__return_storage_ptr__->it).bucket = uVar2;
  __return_storage_ptr__->initialized = bVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }